

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

int ixmlNode_removeChild
              (IXML_Node_conflict *nodeptr,IXML_Node_conflict *oldChild,
              IXML_Node_conflict **returnNode)

{
  int iVar1;
  IXML_Node_conflict **returnNode_local;
  IXML_Node_conflict *oldChild_local;
  IXML_Node_conflict *nodeptr_local;
  
  if ((nodeptr == (IXML_Node_conflict *)0x0) || (oldChild == (IXML_Node_conflict *)0x0)) {
    nodeptr_local._4_4_ = 0x69;
  }
  else {
    iVar1 = ixmlNode_isParent(nodeptr,oldChild);
    if (iVar1 == 0) {
      nodeptr_local._4_4_ = 8;
    }
    else {
      if (oldChild->prevSibling != (Nodeptr_conflict)0x0) {
        oldChild->prevSibling->nextSibling = oldChild->nextSibling;
      }
      if (nodeptr->firstChild == oldChild) {
        nodeptr->firstChild = oldChild->nextSibling;
      }
      if (oldChild->nextSibling != (Nodeptr_conflict)0x0) {
        oldChild->nextSibling->prevSibling = oldChild->prevSibling;
      }
      oldChild->nextSibling = (Nodeptr_conflict)0x0;
      oldChild->prevSibling = (Nodeptr_conflict)0x0;
      oldChild->parentNode = (Nodeptr_conflict)0x0;
      if (returnNode == (IXML_Node_conflict **)0x0) {
        ixmlNode_free(oldChild);
      }
      else {
        *returnNode = oldChild;
      }
      nodeptr_local._4_4_ = 0;
    }
  }
  return nodeptr_local._4_4_;
}

Assistant:

int ixmlNode_removeChild(
	IXML_Node *nodeptr, IXML_Node *oldChild, IXML_Node **returnNode)
{
	if (!nodeptr || !oldChild)
		return IXML_INVALID_PARAMETER;
	if (!ixmlNode_isParent(nodeptr, oldChild))
		return IXML_NOT_FOUND_ERR;
	if (oldChild->prevSibling)
		oldChild->prevSibling->nextSibling = oldChild->nextSibling;
	if (nodeptr->firstChild == oldChild)
		nodeptr->firstChild = oldChild->nextSibling;
	if (oldChild->nextSibling)
		oldChild->nextSibling->prevSibling = oldChild->prevSibling;
	oldChild->nextSibling = NULL;
	oldChild->prevSibling = NULL;
	oldChild->parentNode = NULL;
	if (returnNode)
		*returnNode = oldChild;
	else
		ixmlNode_free(oldChild);

	return IXML_SUCCESS;
}